

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.h
# Opt level: O3

void __thiscall crnlib::symbol_histogram::~symbol_histogram(symbol_histogram *this)

{
  uint *p;
  
  p = (this->m_hist).m_p;
  if (p != (uint *)0x0) {
    crnlib_free(p);
  }
  return;
}

Assistant:

class CRN_EXPORT symbol_histogram
    {
    public:
        inline symbol_histogram(uint size = 0) :
            m_hist(size)
        {
        }

        inline void clear()
        {
            m_hist.clear();
        }

        inline uint size() const
        {
            return static_cast<uint>(m_hist.size());
        }

        inline void inc_freq(uint x, uint amount = 1)
        {
            uint h = m_hist[x];
            CRNLIB_ASSERT(amount <= (0xFFFFFFFF - h));
            m_hist[x] = h + amount;
        }

        inline void set_all(uint val)
        {
            for (uint i = 0; i < m_hist.size(); i++) {
                m_hist[i] = val;
}
        }

        inline void resize(uint new_size)
        {
            m_hist.resize(new_size);
        }

        inline const uint* get_ptr() const
        {
            return m_hist.empty() ? nullptr : &m_hist.front();
        }

        double calc_entropy() const;

        uint operator[](uint i) const
        {
            return m_hist[i];
        }
        uint& operator[](uint i)
        {
            return m_hist[i];
        }

        uint64 get_total() const;

    private:
        crnlib::vector<uint> m_hist;
    }